

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDLImporter::ValidateHeader_Quake1(MDLImporter *this,Header *pcHeader)

{
  DeadlyImportError *pDVar1;
  Logger *pLVar2;
  allocator local_99;
  string local_98;
  undefined1 local_72;
  allocator local_71;
  string local_70;
  undefined1 local_4d;
  allocator local_39;
  string local_38;
  Header *local_18;
  Header *pcHeader_local;
  MDLImporter *this_local;
  
  local_18 = pcHeader;
  pcHeader_local = (Header *)this;
  if (pcHeader->num_frames == 0) {
    local_4d = 1;
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,"[Quake 1 MDL] There are no frames in the file",&local_39);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_38);
    local_4d = 0;
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (pcHeader->num_verts != 0) {
    if (pcHeader->num_tris != 0) {
      if (this->iGSFileVersion == 0) {
        if (0x400 < pcHeader->num_verts) {
          pLVar2 = DefaultLogger::get();
          Logger::warn(pLVar2,"Quake 1 MDL model has more than AI_MDL_MAX_VERTS vertices");
        }
        if (0x800 < local_18->num_tris) {
          pLVar2 = DefaultLogger::get();
          Logger::warn(pLVar2,"Quake 1 MDL model has more than AI_MDL_MAX_TRIANGLES triangles");
        }
        if (0x100 < local_18->num_frames) {
          pLVar2 = DefaultLogger::get();
          Logger::warn(pLVar2,"Quake 1 MDL model has more than AI_MDL_MAX_FRAMES frames");
        }
        if ((this->iGSFileVersion == 0) && (local_18->version != 6)) {
          pLVar2 = DefaultLogger::get();
          Logger::warn(pLVar2,
                       "Quake 1 MDL model has an unknown version: AI_MDL_VERSION (=6) is the expected file format version"
                      );
        }
        if ((local_18->num_skins != 0) &&
           ((local_18->skinwidth == 0 || (local_18->skinheight == 0)))) {
          pLVar2 = DefaultLogger::get();
          Logger::warn(pLVar2,"Skin width or height are 0");
        }
      }
      return;
    }
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_98,"[Quake 1 MDL] There are no triangles in the file",&local_99);
    DeadlyImportError::DeadlyImportError(pDVar1,&local_98);
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  local_72 = 1;
  pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,"[Quake 1 MDL] There are no vertices in the file",&local_71);
  DeadlyImportError::DeadlyImportError(pDVar1,&local_70);
  local_72 = 0;
  __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void MDLImporter::ValidateHeader_Quake1(const MDL::Header* pcHeader)
{
    // some values may not be NULL
    if (!pcHeader->num_frames)
        throw DeadlyImportError( "[Quake 1 MDL] There are no frames in the file");

    if (!pcHeader->num_verts)
        throw DeadlyImportError( "[Quake 1 MDL] There are no vertices in the file");

    if (!pcHeader->num_tris)
        throw DeadlyImportError( "[Quake 1 MDL] There are no triangles in the file");

    // check whether the maxima are exceeded ...however, this applies for Quake 1 MDLs only
    if (!this->iGSFileVersion)
    {
        if (pcHeader->num_verts > AI_MDL_MAX_VERTS)
            ASSIMP_LOG_WARN("Quake 1 MDL model has more than AI_MDL_MAX_VERTS vertices");

        if (pcHeader->num_tris > AI_MDL_MAX_TRIANGLES)
            ASSIMP_LOG_WARN("Quake 1 MDL model has more than AI_MDL_MAX_TRIANGLES triangles");

        if (pcHeader->num_frames > AI_MDL_MAX_FRAMES)
            ASSIMP_LOG_WARN("Quake 1 MDL model has more than AI_MDL_MAX_FRAMES frames");

        // (this does not apply for 3DGS MDLs)
        if (!this->iGSFileVersion && pcHeader->version != AI_MDL_VERSION)
            ASSIMP_LOG_WARN("Quake 1 MDL model has an unknown version: AI_MDL_VERSION (=6) is "
                "the expected file format version");
        if(pcHeader->num_skins && (!pcHeader->skinwidth || !pcHeader->skinheight))
            ASSIMP_LOG_WARN("Skin width or height are 0");
    }
}